

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monsters.cpp
# Opt level: O3

char randmonster(bool wander)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  undefined7 in_register_00000039;
  
  pcVar3 = "KEBSHIROZLCQANYFTWPXUMVGJD";
  if ((int)CONCAT71(in_register_00000039,wander) != 0) {
    pcVar3 = "KEBSH";
  }
  do {
    iVar2 = level;
    iVar1 = rnd(10);
    iVar2 = iVar1 + iVar2 + -6;
    if (iVar2 < 0) {
      iVar2 = rnd(5);
    }
    if (0x19 < iVar2) {
      iVar2 = rnd(5);
      iVar2 = iVar2 + 0x15;
    }
  } while (pcVar3[iVar2] == '\0');
  return pcVar3[iVar2];
}

Assistant:

char randmonster(bool wander)
{
    int d;
    char *mons;

    mons = (wander ? wand_mons : lvl_mons);
    do
    {
        d = level + (rnd(10) - 6);
        if (d < 0)
            d = rnd(5);
        if (d > 25)
            d = rnd(5) + 21;
    } while (mons[d] == 0);
    return mons[d];
}